

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

int archive_write_open_fd(archive *a,int fd)

{
  undefined4 *puVar1;
  undefined4 in_ESI;
  archive *in_RDI;
  archive_write_callback *unaff_retaddr;
  write_fd_data *mine;
  undefined4 in_stack_00000010;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  puVar1 = (undefined4 *)malloc(4);
  if (puVar1 == (undefined4 *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    iVar2 = -0x1e;
  }
  else {
    *puVar1 = in_ESI;
    iVar2 = archive_write_open(a,(void *)CONCAT44(fd,in_stack_00000010),(undefined1 *)mine,
                               unaff_retaddr,
                               (undefined1 *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar2;
}

Assistant:

int
archive_write_open_fd(struct archive *a, int fd)
{
	struct write_fd_data *mine;

	mine = (struct write_fd_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->fd = fd;
#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(mine->fd, O_BINARY);
#endif
	return (archive_write_open(a, mine,
		    file_open, file_write, file_close));
}